

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

decimal_fp<double> fmt::v9::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  char cVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  bool bVar26;
  uint128_fallback uVar27;
  decimal_fp<double> dVar28;
  
  uVar24 = (ulong)x & 0xfffffffffffff;
  uVar25 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar25 == 0) {
    uVar25 = 0xfffffbce;
    if (uVar24 == 0) {
      uVar24 = 0;
      iVar18 = 0;
      goto LAB_00150012;
    }
LAB_0014fc9d:
    iVar18 = (int)(uVar25 * 0x4d105) >> 0x14;
    uVar27 = cache_accessor<double>::get_cached_power(2 - iVar18);
    uVar15 = uVar27.hi_;
    uVar13 = uVar27.lo_;
    iVar21 = ((2 - iVar18) * 0x1a934f >> 0x13) + uVar25;
    bVar14 = (byte)iVar21;
    uVar17 = uVar24 * 2;
    uVar20 = uVar24 * 2 + 1 << (bVar14 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar20;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar15;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar20;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar13;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SUB168(auVar2 * auVar9,8);
    auVar12 = auVar1 * auVar8 + auVar12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar12._8_8_;
    uVar20 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    uVar25 = auVar12._8_4_ + (int)uVar20 * -1000;
    uVar22 = (uint)(uVar15 >> (~bVar14 & 0x3f));
    if (uVar25 < uVar22) {
      if ((uVar25 != 0) || ((auVar12._0_8_ != 0 || ((uVar24 & 1) == 0)))) {
LAB_0014fd87:
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar20;
        iVar18 = iVar18 + 1;
        if (0xabcc77118461cefc < SUB168(auVar5 * ZEXT816(0xabcc77118461cefd),0) ||
            (auVar5 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) !=
            (undefined1  [16])0x0) {
          iVar21 = -2;
          do {
            uVar17 = uVar20;
            uVar20 = uVar17 * -0x70a3d70a3d70a3d7 >> 2 | uVar17 << 0x3e;
            iVar21 = iVar21 + 2;
          } while (uVar20 < 0x28f5c28f5c28f5d);
          uVar24 = uVar17 * -0x3333333333333333 >> 1 | uVar17 << 0x3f;
          bVar26 = uVar24 < 0x199999999999999a;
          if (!bVar26) {
            uVar24 = uVar17;
          }
          goto LAB_0015000d;
        }
        uVar20 = uVar20 / 100000000;
        iVar21 = 6;
        do {
          uVar25 = (uint)uVar20;
          uVar22 = uVar25 * 0x40000000 | uVar25 * -0x3d70a3d7 >> 2;
          uVar20 = (ulong)uVar22;
          iVar21 = iVar21 + 2;
        } while (uVar22 < 0x28f5c29);
LAB_0014ff7d:
        uVar22 = uVar25 * -0x33333333 >> 1 | (uint)((uVar25 * -0x33333333 & 1) != 0) << 0x1f;
        iVar21 = iVar21 + (uint)(uVar22 < 0x1999999a);
        if (0x19999999 < uVar22) {
          uVar22 = uVar25;
        }
        uVar24 = (ulong)uVar22;
        goto LAB_00150010;
      }
      uVar20 = uVar20 - 1;
      uVar25 = 1000;
    }
    else if ((uVar25 <= uVar22) &&
            (auVar4._8_8_ = 0, auVar4._0_8_ = uVar13, auVar10._8_8_ = 0, auVar10._0_8_ = uVar17 - 1,
            uVar16 = SUB168(auVar4 * auVar10,8) + uVar15 * (uVar17 - 1),
            ((uint)(uVar16 << (bVar14 & 0x3f) == 0 &&
                   SUB168(auVar4 * auVar10,0) >> 0x40 - (bVar14 & 0x3f) == 0) & ~(uint)uVar24) != 0
            || (uVar16 >> ((ulong)(byte)(0x40 - bVar14) & 0x3f) & 1) != 0)) goto LAB_0014fd87;
    iVar23 = uVar25 - (uVar22 >> 1);
    uVar25 = iVar23 * 0x290 + 0x8020;
    uVar24 = (ulong)(uVar25 >> 0x10) + uVar20 * 10;
    if ((uVar25 & 0xffff) < 0x290) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar13;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar17;
      uVar17 = SUB168(auVar6 * auVar11,8) + uVar15 * uVar17;
      uVar22 = 0x40 - iVar21;
      if (((uVar17 >> ((ulong)uVar22 & 0x3f) & 1) != 0) == (bool)((byte)iVar23 & 1)) {
        uVar24 = uVar24 - ((byte)(uVar25 >> 0x10) & 1 &
                          (SUB168(auVar6 * auVar11,0) >> ((byte)uVar22 & 0x3f) == 0 &&
                          uVar17 << (bVar14 & 0x3f) == 0));
      }
      else {
        uVar24 = uVar24 - 1;
      }
    }
  }
  else {
    uVar25 = uVar25 - 0x433;
    if (uVar24 != 0) {
      uVar24 = uVar24 + 0x10000000000000;
      goto LAB_0014fc9d;
    }
    iVar18 = (int)(uVar25 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar19 = (char)(iVar18 * -0x1a934f >> 0x13) + (char)uVar25;
    uVar27 = cache_accessor<double>::get_cached_power(-iVar18);
    uVar17 = uVar27.hi_;
    bVar14 = 0xb - cVar19;
    uVar20 = (ulong)((uVar25 & 0xfffffffe) != 2) + (uVar17 - (uVar17 >> 0x36) >> (bVar14 & 0x3f));
    uVar24 = ((uVar17 >> 0x35) + uVar17 >> (bVar14 & 0x3f)) / 10;
    if (uVar24 * 10 < uVar20) {
      uVar24 = (uVar17 >> (10U - cVar19 & 0x3f)) + 1 >> 1;
      if (uVar25 == 0xffffffb3) {
        uVar24 = uVar24 & 0xfffffffffffffffe;
      }
      else {
        uVar24 = uVar24 + (uVar24 < uVar20);
      }
      goto LAB_00150012;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar24;
    iVar18 = iVar18 + 1;
    if (SUB168(auVar7 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar7 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar24 = uVar24 / 100000000;
      iVar21 = 6;
      do {
        uVar25 = (uint)uVar24;
        uVar22 = uVar25 * 0x40000000 | uVar25 * -0x3d70a3d7 >> 2;
        uVar24 = (ulong)uVar22;
        iVar21 = iVar21 + 2;
      } while (uVar22 < 0x28f5c29);
      goto LAB_0014ff7d;
    }
    iVar21 = -2;
    do {
      uVar17 = uVar24;
      uVar24 = uVar17 * -0x70a3d70a3d70a3d7 >> 2 | uVar17 << 0x3e;
      iVar21 = iVar21 + 2;
    } while (uVar24 < 0x28f5c28f5c28f5d);
    uVar24 = uVar17 * -0x3333333333333333 >> 1 | uVar17 << 0x3f;
    bVar26 = uVar24 < 0x199999999999999a;
    if (!bVar26) {
      uVar24 = uVar17;
    }
LAB_0015000d:
    iVar21 = iVar21 + (uint)bVar26;
LAB_00150010:
    iVar18 = iVar18 + iVar21;
  }
LAB_00150012:
  dVar28.exponent = iVar18;
  dVar28.significand = uVar24;
  dVar28._12_4_ = 0;
  return dVar28;
}

Assistant:

decimal_fp<T> to_decimal(T x) noexcept {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}